

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

MemoryAccountantAllocationNode * __thiscall
MemoryAccountant::findOrCreateNodeOfSize(MemoryAccountant *this,size_t size)

{
  size_t sVar1;
  int iVar2;
  MemoryAccountantAllocationNode *pMVar3;
  undefined4 extraout_var;
  MemoryAccountantAllocationNode *pMVar5;
  undefined4 extraout_var_01;
  bool bVar6;
  MemoryAccountantAllocationNode *pMVar4;
  undefined4 extraout_var_00;
  
  if (this->useCacheSizes_ == true) {
    pMVar3 = findNodeOfSize(this,size);
    return pMVar3;
  }
  pMVar3 = this->head_;
  if ((pMVar3 != (MemoryAccountantAllocationNode *)0x0) && (size < pMVar3->size_)) {
    iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                      (this->allocator_,0x30,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                       ,0x199);
    pMVar4 = (MemoryAccountantAllocationNode *)CONCAT44(extraout_var,iVar2);
    pMVar4->size_ = size;
    pMVar4->allocations_ = 0;
    pMVar4->deallocations_ = 0;
    pMVar4->maxAllocations_ = 0;
    pMVar4->currentAllocations_ = 0;
    pMVar4->next_ = pMVar3;
    this->head_ = pMVar4;
  }
  pMVar3 = this->head_;
  bVar6 = pMVar3 == (MemoryAccountantAllocationNode *)0x0;
  if (!bVar6) {
    sVar1 = pMVar3->size_;
    while (sVar1 != size) {
      pMVar4 = pMVar3->next_;
      if ((pMVar4 == (MemoryAccountantAllocationNode *)0x0) || (size < pMVar4->size_)) {
        iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                          (this->allocator_,0x30,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                           ,0x199);
        pMVar5 = (MemoryAccountantAllocationNode *)CONCAT44(extraout_var_00,iVar2);
        pMVar5->size_ = size;
        pMVar5->allocations_ = 0;
        pMVar5->deallocations_ = 0;
        pMVar5->maxAllocations_ = 0;
        pMVar5->currentAllocations_ = 0;
        pMVar5->next_ = pMVar4;
        pMVar3->next_ = pMVar5;
      }
      pMVar3 = pMVar3->next_;
      bVar6 = pMVar3 == (MemoryAccountantAllocationNode *)0x0;
      if (bVar6) goto LAB_001364c2;
      sVar1 = pMVar3->size_;
    }
    if (!bVar6) {
      return pMVar3;
    }
  }
LAB_001364c2:
  pMVar3 = this->head_;
  iVar2 = (*this->allocator_->_vptr_TestMemoryAllocator[2])
                    (this->allocator_,0x30,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                     ,0x199);
  pMVar4 = (MemoryAccountantAllocationNode *)CONCAT44(extraout_var_01,iVar2);
  pMVar4->size_ = size;
  pMVar4->allocations_ = 0;
  pMVar4->deallocations_ = 0;
  pMVar4->maxAllocations_ = 0;
  pMVar4->currentAllocations_ = 0;
  pMVar4->next_ = pMVar3;
  this->head_ = pMVar4;
  return pMVar4;
}

Assistant:

MemoryAccountantAllocationNode* MemoryAccountant::findOrCreateNodeOfSize(size_t size)
{
    if (useCacheSizes_)
      return findNodeOfSize(size);

    if (head_ && head_->size_ > size)
        head_ = createNewAccountantAllocationNode(size, head_);

    for (MemoryAccountantAllocationNode* node = head_; node; node = node->next_) {
        if (node->size_ == size)
            return node;
        if (node->next_ == NULLPTR || node->next_->size_ > size)
            node->next_ = createNewAccountantAllocationNode(size, node->next_);
    }
    head_ = createNewAccountantAllocationNode(size, head_);
    return head_;
}